

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O0

int __thiscall IntegerType::serialise(IntegerType *this,uint8_t *buf,size_t max_len)

{
  uint8_t *puVar1;
  uint8_t *ptr;
  int i;
  size_t max_len_local;
  uint8_t *buf_local;
  IntegerType *this_local;
  
  this_local._4_4_ = BER_CONTAINER::serialise(&this->super_BER_CONTAINER,buf,max_len,4);
  if (-1 < this_local._4_4_) {
    puVar1 = buf + this_local._4_4_;
    *puVar1 = (uint8_t)((uint)this->_value >> 0x18);
    puVar1[1] = (uint8_t)((uint)this->_value >> 0x10);
    puVar1[2] = (uint8_t)((uint)this->_value >> 8);
    puVar1[3] = (uint8_t)this->_value;
    this_local._4_4_ = ((int)puVar1 + 4) - (int)buf;
  }
  return this_local._4_4_;
}

Assistant:

int IntegerType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, 4);
    CHECK_ENCODE_ERR(i);
    uint8_t *ptr = buf + i;

    *ptr++ = _value >> 24 & 0xFF;
    *ptr++ = _value >> 16 & 0xFF;
    *ptr++ = _value >> 8 & 0xFF;
    *ptr++ = _value & 0xFF;
    
    return ptr - buf;
}